

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner::Runner(Runner *this,Ptr<Catch::Config> *config)

{
  Ptr<Catch::Config> *config_local;
  Runner *this_local;
  
  Ptr<Catch::Config>::Ptr(&this->m_config,config);
  std::ofstream::ofstream(&this->m_ofs);
  Ptr<Catch::IStreamingReporter>::Ptr(&this->m_reporter);
  std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::set
            (&this->m_testsAlreadyRun);
  openStream(this);
  makeReporter(this);
  return;
}

Assistant:

Runner( Ptr<Config> const& config )
        :   m_config( config )
        {
            openStream();
            makeReporter();
        }